

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O0

void __thiscall
so_5::disp::prio_dedicated_threads::one_per_prio::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
::disp_data_source_t::distribute(disp_data_source_t *this,mbox_t *mbox)

{
  anon_class_24_3_43158b25 l;
  size_t to;
  mbox_t *in_stack_ffffffffffffffa0;
  suffix_t local_40;
  disp_data_source_t *local_38;
  unsigned_long *local_30;
  mbox_t *local_28;
  unsigned_long local_20;
  size_t agents_count;
  mbox_t *mbox_local;
  disp_data_source_t *this_local;
  
  local_20 = 0;
  local_30 = &local_20;
  l.agents_count = (size_t *)mbox;
  l.this = (disp_data_source_t *)local_30;
  l.mbox = in_stack_ffffffffffffffa0;
  local_38 = this;
  local_28 = mbox;
  agents_count = (size_t)mbox;
  mbox_local = (mbox_t *)this;
  prio::
  for_each_priority<so_5::disp::prio_dedicated_threads::one_per_prio::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>::disp_data_source_t::distribute(so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&)::_lambda(so_5::priority_t)_1_>
            (l);
  to = agents_count;
  local_40 = stats::suffixes::agent_count();
  send<so_5::stats::messages::quantity<unsigned_long>,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::stats::prefix_t&,so_5::stats::suffix_t,unsigned_long&>
            ((intrusive_ptr_t<so_5::abstract_message_box_t> *)to,&this->m_base_prefix,&local_40,
             &local_20);
  return;
}

Assistant:

virtual void
				distribute( const mbox_t & mbox ) override
					{
						std::size_t agents_count = 0;

						so_5::prio::for_each_priority( [&]( priority_t p ) {
								auto agents = m_dispatcher.m_agents_per_priority[
										to_size_t(p) ].load( std::memory_order_acquire );

								agents_count += agents;

								distribute_value_for_work_thread(
										mbox,
										p,
										agents,
										*(m_dispatcher.m_threads[ to_size_t(p) ]) );
							} );

						so_5::send< stats::messages::quantity< std::size_t > >(
								mbox,
								m_base_prefix,
								stats::suffixes::agent_count(),
								agents_count );
					}